

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTag(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *pXVar1;
  ElemStack *this_01;
  char cVar2;
  XMLCh XVar3;
  AttTypes AVar4;
  XMLSize_t XVar5;
  Grammar *pGVar6;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar7;
  XMLValidator *pXVar8;
  XMLReader *this_02;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_03;
  XMLSize_t XVar9;
  XMLDocumentHandler *pXVar10;
  bool bVar11;
  XMLCh XVar12;
  int iVar13;
  undefined4 extraout_var;
  ulong uVar14;
  DTDElementDecl *this_04;
  DTDAttDef *attDef;
  XMLAttr *this_05;
  RefHashTableBucketElem<unsigned_int> *pRVar15;
  XMLCh *pXVar16;
  uint *puVar17;
  undefined4 extraout_var_00;
  XMLCh *text2;
  undefined4 extraout_var_01;
  XMLCh *pXVar18;
  UnexpectedEOFException *this_06;
  XMLSize_t XVar19;
  byte bVar20;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar21;
  XMLCh *pXVar22;
  bool *local_88;
  XMLSize_t failure;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar1 = &(this->super_XMLScanner).fQNameBuf;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar11 = XMLReader::getName((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar1,false);
  if (!bVar11) {
    XVar5 = pXVar1->fIndex;
    if (XVar5 == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar18 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar18[XVar5] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') {
        return false;
      }
    } while (XVar12 != L'<');
    return false;
  }
  XVar5 = (this->super_XMLScanner).fElemStack.fStackTop;
  pXVar18 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar18[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar6 = (this->super_XMLScanner).fGrammar;
  iVar13 = (*(pGVar6->super_XSerializable)._vptr_XSerializable[0xb])
                     (pGVar6,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  this_04 = (DTDElementDecl *)CONCAT44(extraout_var,iVar13);
  if (this_04 == (DTDElementDecl *)0x0) {
    pNVar7 = this->fDTDElemNonDeclPool;
    if (pNVar7->fIdCounter != 0) {
      uVar14 = (ulong)(ushort)*pXVar18;
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        XVar12 = pXVar18[1];
        if (XVar12 != L'\0') {
          pXVar16 = pXVar18 + 2;
          do {
            uVar14 = (ulong)(ushort)XVar12 + (uVar14 >> 0x18) + uVar14 * 0x26;
            XVar12 = *pXVar16;
            pXVar16 = pXVar16 + 1;
          } while (XVar12 != L'\0');
        }
        uVar14 = uVar14 % (pNVar7->fBucketList).fHashModulus;
      }
      pRVar21 = (pNVar7->fBucketList).fBucketList[uVar14];
      if (pRVar21 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar11 = StringHasher::equals
                             ((StringHasher *)&(pNVar7->fBucketList).field_0x30,pXVar18,
                              pRVar21->fKey);
          if (bVar11) {
            this_04 = pRVar21->fData;
            if (this_04 != (DTDElementDecl *)0x0) {
              cVar2 = (this->super_XMLScanner).fValidate;
              goto joined_r0x00296389;
            }
            break;
          }
          pRVar21 = pRVar21->fNext;
        } while (pRVar21 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
    }
    this_04 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_04,pXVar18,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar19 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_04);
    (this_04->super_XMLElementDecl).fId = XVar19;
    if ((this->super_XMLScanner).fValidate != false) {
      (this_04->super_XMLElementDecl).fCreateReason = JustFaultIn;
LAB_002963f4:
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,ElementNotDefined,pXVar18,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00296410;
    }
  }
  else {
    cVar2 = (this->super_XMLScanner).fValidate;
joined_r0x00296389:
    if (cVar2 != '\0') {
      if ((this_04->super_XMLElementDecl).fCreateReason != Declared) goto LAB_002963f4;
LAB_00296410:
      pXVar8 = (this->super_XMLScanner).fValidator;
      (*pXVar8->_vptr_XMLValidator[9])(pXVar8,this_04);
    }
  }
  local_88 = &(this->super_XMLScanner).fValidate;
  this_01 = &(this->super_XMLScanner).fElemStack;
  ElemStack::addLevel(this_01,&this_04->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  if (XVar5 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar16 = (this->super_XMLScanner).fRootElemName,
       pXVar18 != pXVar16 && pXVar16 != (XMLCh *)0x0)) {
      pXVar22 = pXVar18;
      if (pXVar18 == (XMLCh *)0x0) {
LAB_002964b2:
        if (*pXVar16 == L'\0') goto LAB_002964c9;
      }
      else {
        do {
          XVar12 = *pXVar22;
          if (XVar12 == L'\0') goto LAB_002964b2;
          pXVar22 = pXVar22 + 1;
          XVar3 = *pXVar16;
          pXVar16 = pXVar16 + 1;
        } while (XVar12 == XVar3);
      }
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  else if (*local_88 == true) {
    ElemStack::addChild(this_01,(this_04->super_XMLElementDecl).fElementName,true);
  }
LAB_002964c9:
  ReaderMgr::skipPastSpaces(this_00);
  uVar14 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
           fCurCount;
  this->fElemCount = this->fElemCount + 1;
  pXVar1 = &(this->super_XMLScanner).fAttNameBuf;
  XVar19 = 0;
LAB_00296511:
  while( true ) {
    XVar12 = ReaderMgr::peekNextChar(this_00);
    if (((XVar19 != 0) && (XVar12 != L'/')) && (XVar12 != L'>')) {
      if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar12] <
          '\0') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar12 = ReaderMgr::peekNextChar(this_00);
      }
      else {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
    }
    this_02 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    if ((this_02->fgCharCharsTable[(ushort)XVar12] & 0x10) == 0) break;
    if ((ushort)XVar12 < 0x27) {
      if (XVar12 == L'\"') {
LAB_002965f6:
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(this_00);
        ReaderMgr::skipQuotedString(this_00,XVar12);
        ReaderMgr::skipPastSpaces(this_00);
      }
      else if (XVar12 == L'\0') {
        this_06 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (this_06,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0x582,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(this_06,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
    }
    else if ((ushort)XVar12 < 0x2f) {
      if (XVar12 == L'\'') goto LAB_002965f6;
    }
    else {
      if (XVar12 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar11 = ReaderMgr::skippedChar(this_00,L'>');
        bVar20 = 1;
        if (!bVar11) {
          pXVar16 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
LAB_002969f0:
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar16,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        goto LAB_00296a08;
      }
      if (XVar12 == L'<') {
        pXVar16 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
        bVar20 = 0;
        goto LAB_002969f0;
      }
      if (XVar12 == L'>') {
        ReaderMgr::getNextChar(this_00);
        bVar20 = 0;
LAB_00296a08:
        if (XVar19 == 0) {
          XVar19 = 0;
        }
        else {
          Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
        }
        XVar19 = buildAttList(this,XVar19,&this_04->super_XMLElementDecl,
                              (this->super_XMLScanner).fAttrList);
        pXVar10 = (this->super_XMLScanner).fDocHandler;
        if (pXVar10 != (XMLDocumentHandler *)0x0) {
          (*pXVar10->_vptr_XMLDocumentHandler[0xb])
                    (pXVar10,this_04,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
                     (this->super_XMLScanner).fAttrList,XVar19,(ulong)bVar20,(ulong)(XVar5 == 0));
        }
        if (bVar20 == 0) {
          return true;
        }
        if ((*local_88 == true) &&
           (pXVar8 = (this->super_XMLScanner).fValidator,
           iVar13 = (*pXVar8->_vptr_XMLValidator[2])(pXVar8,this_04,0,0), (char)iVar13 == '\0')) {
          pXVar8 = (this->super_XMLScanner).fValidator;
          iVar13 = (*(this_04->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                             (this_04);
          XMLValidator::emitError
                    (pXVar8,ElementNotValidForContent,pXVar18,
                     (XMLCh *)CONCAT44(extraout_var_01,iVar13),(XMLCh *)0x0,(XMLCh *)0x0);
        }
        ElemStack::popTop(this_01);
        if (XVar5 != 0) {
          return true;
        }
        *gotData = false;
        return true;
      }
    }
  }
  pXVar1->fIndex = 0;
  bVar11 = XMLReader::getName(this_02,pXVar1,false);
  if (!bVar11) {
    if (pXVar1->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
    }
    else {
      pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
      pXVar18[pXVar1->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidAttrName,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') {
        return false;
      }
    } while (XVar12 != L'>');
    return false;
  }
  bVar11 = XMLScanner::scanEq(&this->super_XMLScanner,false);
  if (!bVar11) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
    XVar12 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
    if ((ushort)XVar12 < 0x3e) {
      if (XVar12 == L'/') goto LAB_00296511;
      if ((XVar12 == L'\"') || (XVar12 == L'\'')) goto LAB_00296681;
    }
    else if (XVar12 == L'>') goto LAB_00296511;
    if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)XVar12]) goto LAB_00296af9;
  }
LAB_00296681:
  pXVar16 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
  pXVar16[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
  attDef = DTDElementDecl::getAttDef(this_04,pXVar16);
  ReaderMgr::skipPastSpaces(this_00);
  bVar11 = scanAttValue(this,&attDef->super_XMLAttDef,pXVar16,&(this->super_XMLScanner).fAttValueBuf
                       );
  if (!bVar11) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
    XVar12 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
    if (((XVar12 != L'/') && (XVar12 != L'>')) &&
       (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)XVar12])) {
LAB_00296af9:
      if (XVar12 != L'<') {
        return false;
      }
      pXVar18 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return false;
    }
  }
  pXVar22 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
  pXVar22[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
  if (XVar19 < uVar14) {
    this_05 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar19);
  }
  else {
    this_05 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
    XMLAttr::XMLAttr(this_05,(this->super_XMLScanner).fMemoryManager);
    this_03 = &((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
    BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_03,1);
    XVar9 = this_03->fCurCount;
    this_03->fElemList[XVar9] = this_05;
    this_03->fCurCount = XVar9 + 1;
  }
  this_05->fSpecified = true;
  if (attDef == (DTDAttDef *)0x0) {
    QName::setName(this_05->fAttName,L"",pXVar16,0);
    XMLAttr::setValue(this_05,L"");
    this_05->fType = AttTypes_Min;
    pXVar16 = XMLAttr::getQName(this_05);
    bVar11 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                       (this->fUndeclaredAttrRegistry,pXVar16,0);
    if (!bVar11) {
LAB_0029689c:
      text2 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
      XMLScanner::emitError
                (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar16,text2,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  else {
    AVar4 = (attDef->super_XMLAttDef).fType;
    QName::setName(this_05->fAttName,L"",pXVar16,0);
    XMLAttr::setValue(this_05,L"");
    this_05->fType = AVar4;
    for (pRVar15 = this->fAttDefRegistry->fBucketList
                   [(ulong)attDef % this->fAttDefRegistry->fHashModulus];
        pRVar15 != (RefHashTableBucketElem<unsigned_int> *)0x0; pRVar15 = pRVar15->fNext) {
      if ((DTDAttDef *)pRVar15->fKey == attDef) {
        puVar17 = pRVar15->fData;
        if (puVar17 != (uint *)0x0) {
          if (*puVar17 < this->fElemCount) {
            *puVar17 = this->fElemCount;
            goto LAB_002968c2;
          }
          iVar13 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
          pXVar16 = (XMLCh *)CONCAT44(extraout_var_00,iVar13);
          goto LAB_0029689c;
        }
        break;
      }
    }
    puVar17 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
    *puVar17 = this->fElemCount;
    RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put(this->fAttDefRegistry,attDef,puVar17);
  }
LAB_002968c2:
  if (*local_88 == true) {
    pXVar8 = (this->super_XMLScanner).fValidator;
    if (attDef == (DTDAttDef *)0x0) {
      pXVar16 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
      pXVar16[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
      XMLValidator::emitError
                (pXVar8,AttNotDefinedForElement,pXVar16,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      (this->super_XMLScanner).fAttValueBuf.fBuffer[(this->super_XMLScanner).fAttValueBuf.fIndex] =
           L'\0';
      (*pXVar8->_vptr_XMLValidator[8])();
    }
  }
  XMLAttr::setValue(this_05,pXVar22);
  XVar19 = XVar19 + 1;
  goto LAB_00296511;
}

Assistant:

bool DGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    bool validName = fReaderMgr.getName(fQNameBuf);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getName(fAttNameBuf);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);

            // NO NAMESPACE CODE
            {
                curAtt->set(
                    0, namePtr, XMLUni::fgZeroLenString, XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );

                // now need to prepare for duplicate detection
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                    }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                    else {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , attDef->getFullName(), elemDecl->getFullName()
                        );
                    }
                }
                else
                {
                    // reset namePtr so it refers to newly-allocated memory
                    namePtr = (XMLCh *)curAtt->getQName();
                    if (!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                    {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , namePtr, elemDecl->getFullName()
                        );
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    unsigned int uriId = fEmptyNamespaceId;
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}